

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O2

_Bool upb_Array_Append(upb_Array *arr,upb_MessageValue val,upb_Arena *arena)

{
  uint __line;
  _Bool _Var1;
  char *__assertion;
  
  if ((arr->data_dont_copy_me__upb_internal_use_only & 4) == 0) {
    if (arena != (upb_Arena *)0x0) {
      _Var1 = _upb_Array_ResizeUninitialized_dont_copy_me__upb_internal_use_only
                        (arr,arr->size_dont_copy_me__upb_internal_use_only + 1,arena);
      if (_Var1) {
        upb_Array_Set(arr,arr->size_dont_copy_me__upb_internal_use_only - 1,val);
      }
      return _Var1;
    }
    __assertion = "arena";
    __line = 0x3a;
  }
  else {
    __assertion = "!upb_Array_IsFrozen(arr)";
    __line = 0x39;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/array.c"
                ,__line,"_Bool upb_Array_Append(upb_Array *, upb_MessageValue, upb_Arena *)");
}

Assistant:

bool upb_Array_Append(upb_Array* arr, upb_MessageValue val, upb_Arena* arena) {
  UPB_ASSERT(!upb_Array_IsFrozen(arr));
  UPB_ASSERT(arena);
  if (!UPB_PRIVATE(_upb_Array_ResizeUninitialized)(
          arr, arr->UPB_PRIVATE(size) + 1, arena)) {
    return false;
  }
  upb_Array_Set(arr, arr->UPB_PRIVATE(size) - 1, val);
  return true;
}